

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_11x11(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  JLONG z4;
  JLONG z3;
  JLONG z2;
  JLONG z1;
  JLONG tmp25;
  JLONG tmp24;
  JLONG tmp23;
  JLONG tmp22;
  JLONG tmp21;
  JLONG tmp20;
  JLONG tmp14;
  JLONG tmp13;
  JLONG tmp12;
  JLONG tmp11;
  JLONG tmp10;
  int local_238 [16];
  int local_1f8 [8];
  int local_1d8 [8];
  int local_1b8 [8];
  int local_198 [8];
  int local_178 [8];
  int local_158 [8];
  int local_138 [8];
  int local_118 [8];
  int local_f8 [11];
  int local_cc;
  long local_c8;
  int *local_b8;
  short *local_b0;
  short *local_a8;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  uint local_24;
  long local_20;
  
  local_c8 = *(long *)(in_RDI + 0x1a8) + 0x80;
  local_b0 = *(short **)(in_RSI + 0x58);
  local_b8 = local_238;
  local_a8 = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  for (local_cc = 0; local_cc < 8; local_cc = local_cc + 1) {
    local_80 = (long)((int)*local_a8 * (int)*local_b0) * 0x2000 + 0x400;
    lVar1 = (long)((int)local_a8[0x10] * (int)local_b0[0x10]);
    lVar2 = (long)((int)local_a8[0x20] * (int)local_b0[0x20]);
    lVar3 = (long)((int)local_a8[0x30] * (int)local_b0[0x30]);
    local_58 = (lVar2 - lVar3) * 0x517e;
    local_70 = (lVar2 - lVar1) * 0xdc9;
    lVar4 = (lVar1 + lVar3) - lVar2;
    local_78 = local_80 + lVar4 * 0x2b6c;
    local_60 = local_58 + local_70 + local_78 + lVar2 * -0x3a4c;
    local_58 = local_78 + lVar3 * 0x43b5 + local_58;
    local_70 = local_78 + lVar1 * -0x306f + local_70;
    local_78 = local_78 + (lVar1 + lVar3) * -0x24fb;
    local_68 = local_78 + lVar3 * -0x193d;
    local_78 = lVar2 * 0x3e39 + lVar1 * -0x2c83 + local_78;
    local_80 = local_80 + lVar4 * -0x2d41;
    lVar1 = (long)((int)local_a8[8] * (int)local_b0[8]);
    lVar2 = (long)((int)local_a8[0x18] * (int)local_b0[0x18]);
    lVar3 = (long)((int)local_a8[0x28] * (int)local_b0[0x28]);
    lVar4 = (long)((int)local_a8[0x38] * (int)local_b0[0x38]);
    local_50 = (lVar1 + lVar2 + lVar3 + lVar4) * 0xcc0;
    lVar5 = (lVar1 + lVar2) * 0x1c6a;
    local_40 = (lVar1 + lVar3) * 0x1574;
    local_48 = local_50 + (lVar1 + lVar4) * 3000;
    local_30 = lVar5 + local_40 + local_48 + lVar1 * -0x1d8a;
    lVar1 = local_50 + (lVar2 + lVar3) * -0x2537;
    local_40 = lVar1 + lVar3 * -0x2626 + local_40;
    lVar6 = (lVar2 + lVar4) * -0x398b;
    local_38 = lVar6 + lVar1 + lVar2 * 0x4258 + lVar5;
    local_48 = lVar6 + lVar4 * 0x4347 + local_48;
    local_50 = lVar2 * -0x2ef3 + lVar3 * 0x200b + lVar4 * -0x35ea + local_50;
    *local_b8 = (int)(local_58 + local_30 >> 0xb);
    local_b8[0x50] = (int)(local_58 - local_30 >> 0xb);
    local_b8[8] = (int)(local_60 + local_38 >> 0xb);
    local_b8[0x48] = (int)(local_60 - local_38 >> 0xb);
    local_b8[0x10] = (int)(local_68 + local_40 >> 0xb);
    local_b8[0x40] = (int)(local_68 - local_40 >> 0xb);
    local_b8[0x18] = (int)(local_70 + local_48 >> 0xb);
    local_b8[0x38] = (int)(local_70 - local_48 >> 0xb);
    local_b8[0x20] = (int)(local_78 + local_50 >> 0xb);
    local_b8[0x30] = (int)(local_78 - local_50 >> 0xb);
    local_b8[0x28] = (int)(local_80 >> 0xb);
    local_a8 = local_a8 + 1;
    local_b0 = local_b0 + 1;
    local_b8 = local_b8 + 1;
  }
  local_b8 = local_238;
  for (local_cc = 0; local_cc < 0xb; local_cc = local_cc + 1) {
    puVar7 = (undefined1 *)(*(long *)(local_20 + (long)local_cc * 8) + (ulong)local_24);
    lVar1 = ((long)*local_b8 + 0x10) * 0x2000;
    lVar2 = (long)local_b8[2];
    lVar3 = (long)local_b8[4];
    lVar4 = (long)local_b8[6];
    lVar8 = (lVar3 - lVar4) * 0x517e;
    lVar9 = (lVar3 - lVar2) * 0xdc9;
    lVar5 = (lVar2 + lVar4) - lVar3;
    lVar10 = lVar1 + lVar5 * 0x2b6c;
    lVar6 = lVar8 + lVar9 + lVar10 + lVar3 * -0x3a4c;
    lVar8 = lVar10 + lVar4 * 0x43b5 + lVar8;
    lVar9 = lVar10 + lVar2 * -0x306f + lVar9;
    lVar10 = lVar10 + (lVar2 + lVar4) * -0x24fb;
    lVar4 = lVar10 + lVar4 * -0x193d;
    lVar10 = lVar3 * 0x3e39 + lVar2 * -0x2c83 + lVar10;
    lVar2 = (long)local_b8[1];
    lVar3 = (long)local_b8[3];
    lVar11 = (long)local_b8[5];
    lVar12 = (long)local_b8[7];
    lVar13 = (lVar2 + lVar3 + lVar11 + lVar12) * 0xcc0;
    lVar14 = (lVar2 + lVar3) * 0x1c6a;
    lVar15 = (lVar2 + lVar11) * 0x1574;
    lVar16 = lVar13 + (lVar2 + lVar12) * 3000;
    lVar2 = lVar14 + lVar15 + lVar16 + lVar2 * -0x1d8a;
    lVar17 = lVar13 + (lVar3 + lVar11) * -0x2537;
    lVar15 = lVar17 + lVar11 * -0x2626 + lVar15;
    lVar18 = (lVar3 + lVar12) * -0x398b;
    lVar14 = lVar18 + lVar17 + lVar3 * 0x4258 + lVar14;
    lVar16 = lVar18 + lVar12 * 0x4347 + lVar16;
    lVar13 = lVar3 * -0x2ef3 + lVar11 * 0x200b + lVar12 * -0x35ea + lVar13;
    *puVar7 = *(undefined1 *)(local_c8 + (int)((uint)(lVar8 + lVar2 >> 0x12) & 0x3ff));
    puVar7[10] = *(undefined1 *)(local_c8 + (int)((uint)(lVar8 - lVar2 >> 0x12) & 0x3ff));
    puVar7[1] = *(undefined1 *)(local_c8 + (int)((uint)(lVar6 + lVar14 >> 0x12) & 0x3ff));
    puVar7[9] = *(undefined1 *)(local_c8 + (int)((uint)(lVar6 - lVar14 >> 0x12) & 0x3ff));
    puVar7[2] = *(undefined1 *)(local_c8 + (int)((uint)(lVar4 + lVar15 >> 0x12) & 0x3ff));
    puVar7[8] = *(undefined1 *)(local_c8 + (int)((uint)(lVar4 - lVar15 >> 0x12) & 0x3ff));
    puVar7[3] = *(undefined1 *)(local_c8 + (int)((uint)(lVar9 + lVar16 >> 0x12) & 0x3ff));
    puVar7[7] = *(undefined1 *)(local_c8 + (int)((uint)(lVar9 - lVar16 >> 0x12) & 0x3ff));
    puVar7[4] = *(undefined1 *)(local_c8 + (int)((uint)(lVar10 + lVar13 >> 0x12) & 0x3ff));
    puVar7[6] = *(undefined1 *)(local_c8 + (int)((uint)(lVar10 - lVar13 >> 0x12) & 0x3ff));
    puVar7[5] = *(undefined1 *)(local_c8 + (int)((uint)(lVar1 + lVar5 * -0x2d41 >> 0x12) & 0x3ff));
    local_b8 = local_b8 + 8;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_11x11(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 11];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp10 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp10 = LEFT_SHIFT(tmp10, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp10 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp20 = MULTIPLY(z2 - z3, FIX(2.546640132));     /* c2+c4 */
    tmp23 = MULTIPLY(z2 - z1, FIX(0.430815045));     /* c2-c6 */
    z4 = z1 + z3;
    tmp24 = MULTIPLY(z4, -FIX(1.155664402));         /* -(c2-c10) */
    z4 -= z2;
    tmp25 = tmp10 + MULTIPLY(z4, FIX(1.356927976));  /* c2 */
    tmp21 = tmp20 + tmp23 + tmp25 -
            MULTIPLY(z2, FIX(1.821790775));          /* c2+c4+c10-c6 */
    tmp20 += tmp25 + MULTIPLY(z3, FIX(2.115825087)); /* c4+c6 */
    tmp23 += tmp25 - MULTIPLY(z1, FIX(1.513598477)); /* c6+c8 */
    tmp24 += tmp25;
    tmp22 = tmp24 - MULTIPLY(z3, FIX(0.788749120));  /* c8+c10 */
    tmp24 += MULTIPLY(z2, FIX(1.944413522)) -        /* c2+c8 */
             MULTIPLY(z1, FIX(1.390975730));         /* c4+c10 */
    tmp25 = tmp10 - MULTIPLY(z4, FIX(1.414213562));  /* c0 */

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = z1 + z2;
    tmp14 = MULTIPLY(tmp11 + z3 + z4, FIX(0.398430003)); /* c9 */
    tmp11 = MULTIPLY(tmp11, FIX(0.887983902));           /* c3-c9 */
    tmp12 = MULTIPLY(z1 + z3, FIX(0.670361295));         /* c5-c9 */
    tmp13 = tmp14 + MULTIPLY(z1 + z4, FIX(0.366151574)); /* c7-c9 */
    tmp10 = tmp11 + tmp12 + tmp13 -
            MULTIPLY(z1, FIX(0.923107866));              /* c7+c5+c3-c1-2*c9 */
    z1    = tmp14 - MULTIPLY(z2 + z3, FIX(1.163011579)); /* c7+c9 */
    tmp11 += z1 + MULTIPLY(z2, FIX(2.073276588));        /* c1+c7+3*c9-c3 */
    tmp12 += z1 - MULTIPLY(z3, FIX(1.192193623));        /* c3+c5-c7-c9 */
    z1    = MULTIPLY(z2 + z4, -FIX(1.798248910));        /* -(c1+c9) */
    tmp11 += z1;
    tmp13 += z1 + MULTIPLY(z4, FIX(2.102458632));        /* c1+c5+c9-c7 */
    tmp14 += MULTIPLY(z2, -FIX(1.467221301)) +           /* -(c5+c9) */
             MULTIPLY(z3, FIX(1.001388905)) -            /* c1-c9 */
             MULTIPLY(z4, FIX(1.684843907));             /* c3+c9 */

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 10] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 11 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 11; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp10 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp10 = LEFT_SHIFT(tmp10, CONST_BITS);

    z1 = (JLONG)wsptr[2];
    z2 = (JLONG)wsptr[4];
    z3 = (JLONG)wsptr[6];

    tmp20 = MULTIPLY(z2 - z3, FIX(2.546640132));     /* c2+c4 */
    tmp23 = MULTIPLY(z2 - z1, FIX(0.430815045));     /* c2-c6 */
    z4 = z1 + z3;
    tmp24 = MULTIPLY(z4, -FIX(1.155664402));         /* -(c2-c10) */
    z4 -= z2;
    tmp25 = tmp10 + MULTIPLY(z4, FIX(1.356927976));  /* c2 */
    tmp21 = tmp20 + tmp23 + tmp25 -
            MULTIPLY(z2, FIX(1.821790775));          /* c2+c4+c10-c6 */
    tmp20 += tmp25 + MULTIPLY(z3, FIX(2.115825087)); /* c4+c6 */
    tmp23 += tmp25 - MULTIPLY(z1, FIX(1.513598477)); /* c6+c8 */
    tmp24 += tmp25;
    tmp22 = tmp24 - MULTIPLY(z3, FIX(0.788749120));  /* c8+c10 */
    tmp24 += MULTIPLY(z2, FIX(1.944413522)) -        /* c2+c8 */
             MULTIPLY(z1, FIX(1.390975730));         /* c4+c10 */
    tmp25 = tmp10 - MULTIPLY(z4, FIX(1.414213562));  /* c0 */

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];

    tmp11 = z1 + z2;
    tmp14 = MULTIPLY(tmp11 + z3 + z4, FIX(0.398430003)); /* c9 */
    tmp11 = MULTIPLY(tmp11, FIX(0.887983902));           /* c3-c9 */
    tmp12 = MULTIPLY(z1 + z3, FIX(0.670361295));         /* c5-c9 */
    tmp13 = tmp14 + MULTIPLY(z1 + z4, FIX(0.366151574)); /* c7-c9 */
    tmp10 = tmp11 + tmp12 + tmp13 -
            MULTIPLY(z1, FIX(0.923107866));              /* c7+c5+c3-c1-2*c9 */
    z1    = tmp14 - MULTIPLY(z2 + z3, FIX(1.163011579)); /* c7+c9 */
    tmp11 += z1 + MULTIPLY(z2, FIX(2.073276588));        /* c1+c7+3*c9-c3 */
    tmp12 += z1 - MULTIPLY(z3, FIX(1.192193623));        /* c3+c5-c7-c9 */
    z1    = MULTIPLY(z2 + z4, -FIX(1.798248910));        /* -(c1+c9) */
    tmp11 += z1;
    tmp13 += z1 + MULTIPLY(z4, FIX(2.102458632));        /* c1+c5+c9-c7 */
    tmp14 += MULTIPLY(z2, -FIX(1.467221301)) +           /* -(c5+c9) */
             MULTIPLY(z3, FIX(1.001388905)) -            /* c1-c9 */
             MULTIPLY(z4, FIX(1.684843907));             /* c3+c9 */

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}